

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_core.c
# Opt level: O0

_Bool operator_int_cmp(gravity_vm *vm,gravity_value_t *args,uint16_t nargs,uint32_t rindex)

{
  long lVar1;
  gravity_value_t value;
  gravity_value_t value_00;
  gravity_value_t value_01;
  gravity_value_t value_02;
  gravity_fiber_t *fiber;
  char local_1068 [8];
  char _buffer [4096];
  anon_union_8_3_4e90ac68_for_gravity_value_t_1 local_60;
  gravity_value_t v2;
  gravity_value_t v1;
  uint32_t rindex_local;
  uint16_t nargs_local;
  gravity_value_t *args_local;
  gravity_vm *vm_local;
  
  if (args[1].isa == gravity_class_float) {
    args->isa = gravity_class_float;
    (args->field_1).f = (double)(args->field_1).n;
    vm_local._7_1_ = operator_float_cmp(vm,args,nargs,rindex);
  }
  else {
    lVar1 = (args->field_1).n;
    join_0x00000010_0x00000000_ = convert_value2int(vm,args[1]);
    if (_buffer._4088_8_ == 0) {
      snprintf(local_1068,0x1000,"Unable to convert object to Int");
      fiber = gravity_vm_fiber(vm);
      gravity_fiber_seterror(fiber,local_1068);
      value_02.field_1.n = 0;
      value_02.isa = gravity_class_null;
      gravity_vm_setslot(vm,value_02,rindex);
      vm_local._7_1_ = false;
    }
    else {
      if (_buffer._4088_8_ != 0) {
        if (lVar1 == local_60.n) {
          value_01.field_1.n = 0;
          value_01.isa = gravity_class_int;
          gravity_vm_setslot(vm,value_01,rindex);
          return true;
        }
        if (local_60.n < lVar1) {
          value_00.field_1.n = 1;
          value_00.isa = gravity_class_int;
          gravity_vm_setslot(vm,value_00,rindex);
          return true;
        }
      }
      value.field_1.n = -1;
      value.isa = gravity_class_int;
      gravity_vm_setslot(vm,value,rindex);
      vm_local._7_1_ = true;
    }
  }
  return vm_local._7_1_;
}

Assistant:

static bool operator_int_cmp (gravity_vm *vm, gravity_value_t *args, uint16_t nargs, uint32_t rindex) {
    if (VALUE_ISA_FLOAT(args[1])) {
        // args[0] is INT and args[1] is FLOAT, in this case
        // args[0] must be manually converted to FLOAT before the call
        args[0] = VALUE_FROM_FLOAT((gravity_float_t)args[0].n);
        return operator_float_cmp(vm, args, nargs, rindex);
    }

    DECLARE_2VARIABLES(v1, v2, 0, 1);
    INTERNAL_CONVERT_INT(v2, true);
    
    if (VALUE_ISA_VALID(v2)) {
        if (v1.n == v2.n) RETURN_VALUE(VALUE_FROM_INT(0), rindex);
        if (v1.n > v2.n) RETURN_VALUE(VALUE_FROM_INT(1), rindex);
    }
    
    RETURN_VALUE(VALUE_FROM_INT(-1), rindex);
}